

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

void DrawRing(Vector2 center,float innerRadius,float outerRadius,float startAngle,float endAngle,
             int segments,Color color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int local_44;
  float local_40;
  int i;
  float angle;
  float stepLength;
  float th;
  int minSegments;
  float tmp_1;
  float tmp;
  int segments_local;
  float endAngle_local;
  float startAngle_local;
  float outerRadius_local;
  float innerRadius_local;
  Color color_local;
  Vector2 center_local;
  
  if ((startAngle != endAngle) || (NAN(startAngle) || NAN(endAngle))) {
    endAngle_local = outerRadius;
    startAngle_local = innerRadius;
    if ((outerRadius < innerRadius) &&
       (endAngle_local = innerRadius, startAngle_local = outerRadius, innerRadius <= 0.0)) {
      endAngle_local = 0.1;
    }
    tmp = endAngle;
    segments_local = (int)startAngle;
    if (endAngle < startAngle) {
      tmp = startAngle;
      segments_local = (int)endAngle;
    }
    fVar1 = ceilf((tmp - (float)segments_local) / 90.0);
    tmp_1 = (float)segments;
    if (segments < (int)fVar1) {
      fVar2 = powf(1.0 - 0.5 / endAngle_local,2.0);
      fVar2 = acosf(fVar2 + fVar2 + -1.0);
      fVar2 = ceilf(6.2831855 / fVar2);
      tmp_1 = (float)(int)(((tmp - (float)segments_local) * fVar2) / 360.0);
      if ((int)tmp_1 < 1) {
        tmp_1 = (float)(int)fVar1;
      }
    }
    if (0.0 < startAngle_local) {
      fVar1 = (tmp - (float)segments_local) / (float)(int)tmp_1;
      local_40 = (float)segments_local;
      rlCheckRenderBatchLimit((int)tmp_1 << 2);
      rlSetTexture(texShapes.id);
      rlBegin(7);
      for (local_44 = 0; local_44 < (int)tmp_1; local_44 = local_44 + 1) {
        outerRadius_local._0_1_ = color.r;
        outerRadius_local._1_1_ = color.g;
        outerRadius_local._2_1_ = color.b;
        outerRadius_local._3_1_ = color.a;
        rlColor4ub(outerRadius_local._0_1_,outerRadius_local._1_1_,outerRadius_local._2_1_,
                   outerRadius_local._3_1_);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        innerRadius_local = center.x;
        fVar2 = sinf(local_40 * 0.017453292);
        color_local = (Color)center.y;
        fVar3 = cosf(local_40 * 0.017453292);
        rlVertex2f(fVar2 * startAngle_local + innerRadius_local,
                   fVar3 * startAngle_local + (float)color_local);
        rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        fVar2 = sinf(local_40 * 0.017453292);
        fVar3 = cosf(local_40 * 0.017453292);
        rlVertex2f(fVar2 * endAngle_local + innerRadius_local,
                   fVar3 * endAngle_local + (float)color_local);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
        fVar2 = sinf((local_40 + fVar1) * 0.017453292);
        fVar3 = cosf((local_40 + fVar1) * 0.017453292);
        rlVertex2f(fVar2 * endAngle_local + innerRadius_local,
                   fVar3 * endAngle_local + (float)color_local);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                     texShapesRec.y / (float)texShapes.height);
        fVar2 = sinf((local_40 + fVar1) * 0.017453292);
        fVar3 = cosf((local_40 + fVar1) * 0.017453292);
        rlVertex2f(fVar2 * startAngle_local + innerRadius_local,
                   fVar3 * startAngle_local + (float)color_local);
        local_40 = fVar1 + local_40;
      }
      rlEnd();
      rlSetTexture(0);
    }
    else {
      DrawCircleSector(center,endAngle_local,(float)segments_local,tmp,(int)tmp_1,color);
    }
  }
  return;
}

Assistant:

void DrawRing(Vector2 center, float innerRadius, float outerRadius, float startAngle, float endAngle, int segments, Color color)
{
    if (startAngle == endAngle) return;

    // Function expects (outerRadius > innerRadius)
    if (outerRadius < innerRadius)
    {
        float tmp = outerRadius;
        outerRadius = innerRadius;
        innerRadius = tmp;

        if (outerRadius <= 0.0f) outerRadius = 0.1f;
    }

    // Function expects (endAngle > startAngle)
    if (endAngle < startAngle)
    {
        // Swap values
        float tmp = startAngle;
        startAngle = endAngle;
        endAngle = tmp;
    }

    int minSegments = (int)ceilf((endAngle - startAngle)/90);

    if (segments < minSegments)
    {
        // Calculate the maximum angle between segments based on the error rate (usually 0.5f)
        float th = acosf(2*powf(1 - SMOOTH_CIRCLE_ERROR_RATE/outerRadius, 2) - 1);
        segments = (int)((endAngle - startAngle)*ceilf(2*PI/th)/360);

        if (segments <= 0) segments = minSegments;
    }

    // Not a ring
    if (innerRadius <= 0.0f)
    {
        DrawCircleSector(center, outerRadius, startAngle, endAngle, segments, color);
        return;
    }

    float stepLength = (endAngle - startAngle)/(float)segments;
    float angle = startAngle;

#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlCheckRenderBatchLimit(4*segments);

    rlSetTexture(texShapes.id);

    rlBegin(RL_QUADS);
        for (int i = 0; i < segments; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*innerRadius, center.y + cosf(DEG2RAD*angle)*innerRadius);

            rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*outerRadius, center.y + cosf(DEG2RAD*angle)*outerRadius);

            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*outerRadius);

            rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*innerRadius);

            angle += stepLength;
        }
    rlEnd();

    rlSetTexture(0);
#else
    rlCheckRenderBatchLimit(6*segments);

    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < segments; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlVertex2f(center.x + sinf(DEG2RAD*angle)*innerRadius, center.y + cosf(DEG2RAD*angle)*innerRadius);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*outerRadius, center.y + cosf(DEG2RAD*angle)*outerRadius);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*innerRadius);

            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*innerRadius);
            rlVertex2f(center.x + sinf(DEG2RAD*angle)*outerRadius, center.y + cosf(DEG2RAD*angle)*outerRadius);
            rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + cosf(DEG2RAD*(angle + stepLength))*outerRadius);

            angle += stepLength;
        }
    rlEnd();
#endif
}